

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetFirstTime(Cluster *this)

{
  longlong lVar1;
  Cluster *in_RDI;
  Block *pBlock;
  long status;
  BlockEntry *pEntry;
  BlockEntry **in_stack_ffffffffffffffe0;
  Cluster *in_stack_ffffffffffffffe8;
  Block *in_stack_fffffffffffffff8;
  
  lVar1 = GetFirst(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (-1 < lVar1) {
    if (in_stack_ffffffffffffffe8 == (Cluster *)0x0) {
      lVar1 = GetTime((Cluster *)0x0);
    }
    else {
      (*(code *)in_stack_ffffffffffffffe8->m_pSegment->m_start)();
      lVar1 = Block::GetTime(in_stack_fffffffffffffff8,in_RDI);
    }
  }
  return lVar1;
}

Assistant:

long long Cluster::GetFirstTime() const {
  const BlockEntry* pEntry;

  const long status = GetFirst(pEntry);

  if (status < 0)  // error
    return status;

  if (pEntry == NULL)  // empty cluster
    return GetTime();

  const Block* const pBlock = pEntry->GetBlock();
  assert(pBlock);

  return pBlock->GetTime(this);
}